

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_event_decoder.c
# Opt level: O1

int pt_evt_decoder_init(pt_event_decoder *decoder,pt_config *uconfig)

{
  int iVar1;
  pt_config config;
  pt_config local_120;
  
  if (decoder != (pt_event_decoder *)0x0) {
    iVar1 = pt_config_from_user(&local_120,uconfig);
    if (-1 < iVar1) {
      *(undefined8 *)&(decoder->flags).variant = local_120.flags.variant._0_8_;
      *(undefined8 *)((long)&(decoder->flags).variant + 8) = local_120.flags.variant._8_8_;
      local_120.flags.variant._0_8_ = 0;
      local_120.flags.variant._8_8_ = 0;
      iVar1 = pt_pkt_decoder_init(&decoder->pacdec,&local_120);
      if (-1 < iVar1) {
        pt_evt_reset(decoder);
        iVar1 = 0;
      }
    }
    return iVar1;
  }
  return -1;
}

Assistant:

int pt_evt_decoder_init(struct pt_event_decoder *decoder,
			const struct pt_config *uconfig)
{
	struct pt_config config;
	int errcode;

	if (!decoder)
		return -pte_internal;

	errcode = pt_config_from_user(&config, uconfig);
	if (errcode < 0)
		return errcode;

	/* The user supplied decoder flags. */
	decoder->flags = config.flags;

	/* Set the flags we need for the packet decoder we use. */
	errcode = pt_evt_init_pkt_flags(&config.flags, &decoder->flags);
	if (errcode < 0)
		return errcode;

	errcode = pt_pkt_decoder_init(&decoder->pacdec, &config);
	if (errcode < 0)
		return errcode;

	return pt_evt_reset(decoder);
}